

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O2

bool Unit_Test::verifyImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *value,bool isAnyValue)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  imageException *this;
  ulong uVar5;
  uchar *puVar6;
  long lVar7;
  uchar *puVar8;
  uchar *puVar9;
  ulong uVar10;
  uchar *puVar11;
  
  if ((((height == 0) || (width == 0)) || (image->_data == (uchar *)0x0)) ||
     ((image->_width < width + x || (image->_height < height + y)))) {
    this = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this,"Bad input parameters in image function");
    __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
  }
  uVar2 = image->_rowSize;
  uVar5 = (ulong)(width * image->_colorCount);
  puVar3 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = image->_data + (ulong)(x * image->_colorCount) + (ulong)(y * uVar2);
  puVar9 = puVar8 + height * uVar2;
  for (; puVar8 != puVar9; puVar8 = puVar8 + uVar2) {
    if (isAnyValue) {
      for (puVar6 = puVar8; puVar11 = puVar4, puVar6 != puVar8 + uVar5; puVar6 = puVar6 + 1) {
        do {
          if (puVar11 == puVar3) goto LAB_0012e32a;
          uVar1 = *puVar11;
          puVar11 = puVar11 + 1;
        } while (*puVar6 != uVar1);
      }
    }
    else {
      lVar7 = 0;
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        if (puVar8[uVar10] != puVar4[lVar7]) goto LAB_0012e32a;
        lVar7 = lVar7 + 1;
        if (lVar7 == (long)puVar3 - (long)puVar4) {
          lVar7 = 0;
        }
      }
    }
  }
LAB_0012e32a:
  return puVar8 == puVar9;
}

Assistant:

bool verifyImage( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                      const std::vector < uint8_t > & value, bool isAnyValue )
    {
        if( image.empty() || width == 0 || height == 0 || x + width > image.width() || y + height > image.height() )
            throw imageException( "Bad input parameters in image function" );

        const uint32_t rowSize  = image.rowSize();
        const uint8_t * outputY = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY    = outputY + rowSize * height;

        width = width * image.colorCount();

        for ( ; outputY != endY; outputY += rowSize ) {
            const uint8_t * outputX = outputY;
            const uint8_t * endX    = outputX + width;

            if( isAnyValue ) {
                for( ; outputX != endX; ++outputX ) {
                    bool equal = false;

                    for( std::vector < uint8_t >::const_iterator v = value.begin(); v != value.end(); ++v ) {
                        if( (*outputX) == (*v) ) {
                            equal = true;
                            break;
                        }
                    }

                    if( !equal )
                        return false;
                }
            }
            else {
                size_t id = 0;
                for( ; outputX != endX; ++outputX ) {
                    if( (*outputX) != value[id++] )
                        return false;

                    if( id == value.size() )
                        id = 0;
                }
            }
        }

        return true;
    }